

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdcolmap.c
# Opt level: O2

void add_map_entry(j_decompress_ptr cinfo,int R,int G,int B)

{
  uint uVar1;
  JSAMPARRAY ppJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  ulong uVar6;
  ulong uVar7;
  
  ppJVar2 = cinfo->colormap;
  pJVar3 = *ppJVar2;
  pJVar4 = ppJVar2[1];
  pJVar5 = ppJVar2[2];
  uVar1 = cinfo->actual_number_of_colors;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  while( true ) {
    if (uVar7 == uVar6) {
      if (0xff < (int)uVar1) {
        *(undefined8 *)&cinfo->err->msg_code = 0x10000000039;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      pJVar3[(int)uVar1] = (JSAMPLE)R;
      pJVar4[(int)uVar1] = (JSAMPLE)G;
      pJVar5[(int)uVar1] = (JSAMPLE)B;
      cinfo->actual_number_of_colors = cinfo->actual_number_of_colors + 1;
      return;
    }
    if ((((uint)pJVar3[uVar6] == R) && ((uint)pJVar4[uVar6] == G)) && ((uint)pJVar5[uVar6] == B))
    break;
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

LOCAL(void)
add_map_entry(j_decompress_ptr cinfo, int R, int G, int B)
{
  JSAMPROW colormap0 = cinfo->colormap[0];
  JSAMPROW colormap1 = cinfo->colormap[1];
  JSAMPROW colormap2 = cinfo->colormap[2];
  int ncolors = cinfo->actual_number_of_colors;
  int index;

  /* Check for duplicate color. */
  for (index = 0; index < ncolors; index++) {
    if (colormap0[index] == R && colormap1[index] == G &&
        colormap2[index] == B)
      return;                   /* color is already in map */
  }

  /* Check for map overflow. */
  if (ncolors >= (MAXJSAMPLE + 1))
    ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, (MAXJSAMPLE + 1));

  /* OK, add color to map. */
  colormap0[ncolors] = (JSAMPLE)R;
  colormap1[ncolors] = (JSAMPLE)G;
  colormap2[ncolors] = (JSAMPLE)B;
  cinfo->actual_number_of_colors++;
}